

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall Loop::InsertLandingPad(Loop *this,FlowGraph *fg)

{
  uint num;
  bool bVar1;
  IRKind IVar2;
  RegionType RVar3;
  Instr *pIVar4;
  LabelInstr *this_00;
  LabelInstr *pLVar5;
  Region *pRVar6;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  Type *ppFVar7;
  BasicBlock *pBVar8;
  Loop *this_02;
  BranchInstr *this_03;
  BasicBlock *block_00;
  bool local_a1;
  BranchInstr *branch;
  FlowEdge **edge;
  EditingIterator iter;
  BasicBlock **block;
  EditingIterator iter_1;
  Loop *parentLoop;
  LabelInstr *landingPadLabel;
  Instr *headInstr;
  BasicBlock *landingPad;
  BasicBlock *headBlock;
  FlowGraph *fg_local;
  Loop *this_local;
  
  headBlock = (BasicBlock *)fg;
  fg_local = (FlowGraph *)this;
  landingPad = GetHeadBlock(this);
  headInstr = (Instr *)BasicBlock::New((FlowGraph *)headBlock);
  this->landingPad = (BasicBlock *)headInstr;
  pIVar4 = BasicBlock::GetFirstInstr(landingPad);
  this_00 = IR::LabelInstr::New(Label,pIVar4->m_func,false);
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,pIVar4);
  IR::Instr::InsertBefore(pIVar4,&this_00->super_Instr);
  IR::LabelInstr::SetBasicBlock(this_00,(BasicBlock *)headInstr);
  pIVar4 = BasicBlock::GetFirstInstr(landingPad);
  pLVar5 = IR::Instr::AsLabelInstr(pIVar4);
  pRVar6 = IR::LabelInstr::GetRegion(pLVar5);
  IR::LabelInstr::SetRegion(this_00,pRVar6);
  pIVar4 = BasicBlock::GetFirstInstr(landingPad);
  pLVar5 = IR::Instr::AsLabelInstr(pIVar4);
  this_00->field_0x78 = this_00->field_0x78 & 0xfb | ((byte)pLVar5->field_0x78 >> 2 & 1) << 2;
  num = *(uint *)&headBlock->trackingByteCodeUpwardExposedUsed;
  *(uint *)&headBlock->trackingByteCodeUpwardExposedUsed = num + 1;
  BasicBlock::SetBlockNum((BasicBlock *)headInstr,num);
  BasicBlock::SetFirstInstr((BasicBlock *)headInstr,&this_00->super_Instr);
  BasicBlock::SetLastInstr((BasicBlock *)headInstr,&this_00->super_Instr);
  *(BasicBlock **)&headInstr->m_noLazyHelperAssert = landingPad->prev;
  **(undefined8 **)&headInstr->m_noLazyHelperAssert = headInstr;
  headInstr->_vptr_Instr = (_func_int **)landingPad;
  landingPad->prev = (BasicBlock *)headInstr;
  iter_1.super_EditingIterator.last = (NodeBase *)this->parent;
  headInstr->m_next = (Instr *)iter_1.super_EditingIterator.last;
  do {
    if (iter_1.super_EditingIterator.last == (NodeBase *)0x0) {
      this_01 = &BasicBlock::GetPredList(landingPad)->
                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
                ((EditingIterator *)&edge,this_01);
      while (bVar1 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                               ((EditingIterator *)&edge), bVar1) {
        ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&edge);
        pBVar8 = FlowEdge::GetPred(*ppFVar7);
        if (pBVar8->loop != this) {
          pBVar8 = FlowEdge::GetPred(*ppFVar7);
          bVar1 = IsDescendentOrSelf(this,pBVar8->loop);
          if (!bVar1) {
            pBVar8 = FlowEdge::GetPred(*ppFVar7);
            pIVar4 = BasicBlock::GetLastInstr(pBVar8);
            bVar1 = IR::Instr::IsBranchInstr(pIVar4);
            if (bVar1) {
              this_02 = (Loop *)BasicBlock::GetFirstInstr(landingPad);
              this_local = this_02;
              IVar2 = IR::Instr::GetKind((Instr *)this_02);
              local_a1 = true;
              if (IVar2 != InstrKindLabel) {
                local_a1 = IR::Instr::IsProfiledLabelInstr((Instr *)this_02);
              }
              if (local_a1 != false) {
                pBVar8 = FlowEdge::GetPred(*ppFVar7);
                pIVar4 = BasicBlock::GetLastInstr(pBVar8);
                this_03 = IR::Instr::AsBranchInstr(pIVar4);
                pIVar4 = BasicBlock::GetFirstInstr(landingPad);
                pLVar5 = IR::Instr::AsLabelInstr(pIVar4);
                IR::BranchInstr::ReplaceTarget(this_03,pLVar5,this_00);
              }
            }
            pBVar8 = landingPad;
            block_00 = FlowEdge::GetPred(*ppFVar7);
            BasicBlock::UnlinkPred(pBVar8,block_00,false);
            BasicBlock::AddPred((BasicBlock *)headInstr,*ppFVar7,(FlowGraph *)headBlock);
            FlowEdge::SetSucc(*ppFVar7,(BasicBlock *)headInstr);
          }
        }
      }
      FlowGraph::AddEdge((FlowGraph *)headBlock,(BasicBlock *)headInstr,landingPad);
      pIVar4 = BasicBlock::GetFirstInstr(landingPad);
      pLVar5 = IR::Instr::AsLabelInstr(pIVar4);
      pRVar6 = IR::LabelInstr::GetRegion(pLVar5);
      if (pRVar6 != (Region *)0x0) {
        pIVar4 = BasicBlock::GetFirstInstr(landingPad);
        pLVar5 = IR::Instr::AsLabelInstr(pIVar4);
        pRVar6 = IR::LabelInstr::GetRegion(pLVar5);
        RVar3 = Region::GetType(pRVar6);
        if (RVar3 != RegionTypeRoot) {
          this_00->field_0x78 = this_00->field_0x78 & 0xfb | 4;
        }
      }
      return;
    }
    SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&block,
               (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
               (iter_1.super_EditingIterator.last + 4));
    do {
      bVar1 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)&block);
      if (!bVar1) goto LAB_0053278e;
      iter.last = (NodeBase *)
                  SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&block);
    } while (((*(ushort *)&((Type)(iter.last)->next)->field_0x18 & 1) != 0) ||
            ((Type)(iter.last)->next != landingPad));
    SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
              ((EditingIterator *)&block,(BasicBlock **)&headInstr);
LAB_0053278e:
    iter_1.super_EditingIterator.last = iter_1.super_EditingIterator.last[8].next;
  } while( true );
}

Assistant:

void
Loop::InsertLandingPad(FlowGraph *fg)
{
    BasicBlock *headBlock = this->GetHeadBlock();

    // Always create a landing pad.  This allows globopt to easily hoist instructions
    // and re-optimize the block if needed.
    BasicBlock *landingPad = BasicBlock::New(fg);
    this->landingPad = landingPad;
    IR::Instr * headInstr = headBlock->GetFirstInstr();
    IR::LabelInstr *landingPadLabel = IR::LabelInstr::New(Js::OpCode::Label, headInstr->m_func);
    landingPadLabel->SetByteCodeOffset(headInstr);
    headInstr->InsertBefore(landingPadLabel);

    landingPadLabel->SetBasicBlock(landingPad);
    landingPadLabel->SetRegion(headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion());
    landingPadLabel->m_hasNonBranchRef = headBlock->GetFirstInstr()->AsLabelInstr()->m_hasNonBranchRef;
    landingPad->SetBlockNum(fg->blockCount++);
    landingPad->SetFirstInstr(landingPadLabel);
    landingPad->SetLastInstr(landingPadLabel);

    landingPad->prev = headBlock->prev;
    landingPad->prev->next = landingPad;
    landingPad->next = headBlock;
    headBlock->prev = landingPad;

    Loop *parentLoop = this->parent;
    landingPad->loop = parentLoop;

    // We need to add this block to the block list of the parent loops
    while (parentLoop)
    {
        // Find the head block in the block list of the parent loop
        FOREACH_BLOCK_IN_LOOP_EDITING(block, parentLoop, iter)
        {
            if (block == headBlock)
            {
                // Add the landing pad to the block list
                iter.InsertBefore(landingPad);
                break;
            }
        } NEXT_BLOCK_IN_LOOP_EDITING;

        parentLoop = parentLoop->parent;
    }

    // Fix predecessor flow edges
    FOREACH_PREDECESSOR_EDGE_EDITING(edge, headBlock, iter)
    {
        // Make sure it isn't a back-edge
        if (edge->GetPred()->loop != this && !this->IsDescendentOrSelf(edge->GetPred()->loop))
        {
            if (edge->GetPred()->GetLastInstr()->IsBranchInstr() && headBlock->GetFirstInstr()->IsLabelInstr())
            {
                IR::BranchInstr *branch = edge->GetPred()->GetLastInstr()->AsBranchInstr();
                branch->ReplaceTarget(headBlock->GetFirstInstr()->AsLabelInstr(), landingPadLabel);
            }
            headBlock->UnlinkPred(edge->GetPred(), false);
            landingPad->AddPred(edge, fg);
            edge->SetSucc(landingPad);
        }
    } NEXT_PREDECESSOR_EDGE_EDITING;

    fg->AddEdge(landingPad, headBlock);

    if (headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion() && headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion()->GetType() != RegionTypeRoot)
    {
        landingPadLabel->m_hasNonBranchRef = true;
    }
}